

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O2

void __thiscall wabt::AST::Construct(AST *this,Expr *e)

{
  ModuleContext *pMVar1;
  BlockExprBase<(wabt::ExprType)7> *be;
  VarExpr<(wabt::ExprType)9> *pVVar2;
  Label *pLVar3;
  IfExpr *pIVar4;
  VarExpr<(wabt::ExprType)8> *pVVar5;
  Node *pNVar6;
  VarExpr<(wabt::ExprType)22> *ve;
  VarExpr<(wabt::ExprType)23> *ve_00;
  VarExpr<(wabt::ExprType)18> *ve_01;
  VarExpr<(wabt::ExprType)19> *ve_02;
  BlockExprBase<(wabt::ExprType)25> *be_00;
  VarExpr<(wabt::ExprType)24> *ve_03;
  ExprType EVar7;
  LabelType LVar8;
  Index IVar9;
  Arities AVar10;
  
  AVar10 = ModuleContext::GetExprArity(this->mc,e);
  EVar7 = e->type_;
  switch(EVar7) {
  case Block:
    be = cast<wabt::BlockExprBase<(wabt::ExprType)7>,wabt::Expr>(e);
    Block<(wabt::ExprType)7>(this,be,Block);
    return;
  case Br:
    pMVar1 = this->mc;
    pVVar5 = cast<wabt::VarExpr<(wabt::ExprType)8>,wabt::Expr>(e);
    pLVar3 = ModuleContext::GetLabel(pMVar1,&pVVar5->var);
    LVar8 = pLVar3->label_type;
    EVar7 = Br;
    IVar9 = 0;
    break;
  case BrIf:
    pMVar1 = this->mc;
    pVVar2 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(e);
    pLVar3 = ModuleContext::GetLabel(pMVar1,&pVVar2->var);
    LVar8 = pLVar3->label_type;
    EVar7 = BrIf;
    IVar9 = 1;
    break;
  default:
    IVar9 = AVar10.nargs;
    goto LAB_00166c50;
  case GlobalGet:
    ve_01 = cast<wabt::VarExpr<(wabt::ExprType)18>,wabt::Expr>(e);
    Get<(wabt::ExprType)18>(this,ve_01,false);
    return;
  case GlobalSet:
    ve_02 = cast<wabt::VarExpr<(wabt::ExprType)19>,wabt::Expr>(e);
    Set<(wabt::ExprType)19>(this,ve_02,false);
    return;
  case If:
    pIVar4 = cast<wabt::IfExpr,wabt::Expr>(e);
    this->value_stack_depth = this->value_stack_depth + -1;
    ModuleContext::BeginBlock(this->mc,Block,&pIVar4->true_);
    Construct(this,&(pIVar4->true_).exprs,
              (Index)((ulong)((long)*(pointer *)
                                     ((long)&(pIVar4->true_).decl.sig.result_types.
                                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                             ._M_impl.super__Vector_impl_data + 8) -
                             (long)(pIVar4->true_).decl.sig.result_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2),false);
    if ((pIVar4->false_).size_ != 0) {
      Construct(this,&pIVar4->false_,
                (Index)((ulong)((long)*(pointer *)
                                       ((long)&(pIVar4->true_).decl.sig.result_types.
                                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                                               ._M_impl.super__Vector_impl_data + 8) -
                               (long)(pIVar4->true_).decl.sig.result_types.
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 2),false);
    }
    ModuleContext::EndBlock(this->mc);
    this->value_stack_depth = this->value_stack_depth + 1;
    IVar9 = 3 - ((pIVar4->false_).size_ == 0);
    EVar7 = If;
LAB_00166c50:
    InsertNode(this,Expr,EVar7,e,IVar9);
    return;
  case LocalGet:
    ve = cast<wabt::VarExpr<(wabt::ExprType)22>,wabt::Expr>(e);
    Get<(wabt::ExprType)22>(this,ve,true);
    return;
  case LocalSet:
    ve_00 = cast<wabt::VarExpr<(wabt::ExprType)23>,wabt::Expr>(e);
    Set<(wabt::ExprType)23>(this,ve_00,true);
    return;
  case LocalTee:
    ve_03 = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(e);
    Set<(wabt::ExprType)24>(this,ve_03,true);
    if (this->value_stack_depth != 1) {
      return;
    }
    Get<(wabt::ExprType)24>(this,ve_03,true);
    return;
  case Loop:
    be_00 = cast<wabt::BlockExprBase<(wabt::ExprType)25>,wabt::Expr>(e);
    Block<(wabt::ExprType)25>(this,be_00,Loop);
    return;
  }
  pNVar6 = InsertNode(this,Expr,EVar7,e,IVar9);
  (pNVar6->u).field_0.var_start = LVar8;
  return;
}

Assistant:

void Construct(const Expr& e) {
    auto arity = mc.GetExprArity(e);
    switch (e.type()) {
      case ExprType::LocalGet: {
        Get(*cast<LocalGetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalGet: {
        Get(*cast<GlobalGetExpr>(&e), false);
        return;
      }
      case ExprType::LocalSet: {
        Set(*cast<LocalSetExpr>(&e), true);
        return;
      }
      case ExprType::GlobalSet: {
        Set(*cast<GlobalSetExpr>(&e), false);
        return;
      }
      case ExprType::LocalTee: {
        auto& lt = *cast<LocalTeeExpr>(&e);
        Set(lt, true);
        if (value_stack_depth == 1) {  // Tee is the only thing on there.
          Get(lt, true);  // Now Set + Get instead.
        } else {
          // Things are above us on the stack so the Tee can't be eliminated.
          // The Set makes this work as a Tee when consumed by a parent.
        }
        return;
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(&e);
        value_stack_depth--;  // Condition.
        mc.BeginBlock(LabelType::Block, ife->true_);
        Construct(ife->true_.exprs, ife->true_.decl.GetNumResults(), false);
        if (!ife->false_.empty()) {
          Construct(ife->false_, ife->true_.decl.GetNumResults(), false);
        }
        mc.EndBlock();
        value_stack_depth++;  // Put Condition back.
        InsertNode(NodeType::Expr, ExprType::If, &e, ife->false_.empty() ? 2 : 3);
        return;
      }
      case ExprType::Block: {
        Block(*cast<BlockExpr>(&e), LabelType::Block);
        return;
      }
      case ExprType::Loop: {
        Block(*cast<LoopExpr>(&e), LabelType::Loop);
        return;
      }
      case ExprType::Br: {
        InsertNode(NodeType::Expr, ExprType::Br, &e, 0).u.lt =
            mc.GetLabel(cast<BrExpr>(&e)->var)->label_type;
        return;
      }
      case ExprType::BrIf: {
        InsertNode(NodeType::Expr, ExprType::BrIf, &e, 1).u.lt =
            mc.GetLabel(cast<BrIfExpr>(&e)->var)->label_type;
        return;
      }
      default: {
        InsertNode(NodeType::Expr, e.type(), &e, arity.nargs);
        return;
      }
    }
  }